

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

void google::protobuf::TestUtil::SetDefaultFields<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  byte *pbVar1;
  bool bVar2;
  FieldDescriptor *pFVar3;
  Arena *pAVar4;
  string_view value;
  string_view value_00;
  string_view name;
  string_view name_00;
  Metadata MVar5;
  Metadata MVar6;
  string local_68;
  string local_48;
  
  *(undefined8 *)((long)&message->field_0 + 0x2d0) = 0x19300000191;
  (message->field_0)._impl_.default_int64_ = 0x192;
  (message->field_0)._impl_.default_uint64_ = 0x194;
  *(undefined8 *)((long)&message->field_0 + 0x2e8) = 0x19700000195;
  (message->field_0)._impl_.default_sint64_ = 0x196;
  (message->field_0)._impl_.default_fixed64_ = 0x198;
  *(undefined8 *)((long)&message->field_0 + 0x300) = 0x43cd800000000199;
  (message->field_0)._impl_.default_sfixed64_ = 0x19a;
  (message->field_0)._impl_.default_double_ = 412.0;
  (message->field_0)._impl_.default_bool_ = false;
  *(ulong *)(message->field_0)._impl_._has_bits_.has_bits_ =
       *(ulong *)(message->field_0)._impl_._has_bits_.has_bits_ | 0x1fff08000000;
  pAVar4 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  value._M_str = "415";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(&(message->field_0)._impl_.default_string_,value,pAVar4);
  pbVar1 = (byte *)((long)&message->field_0 + 3);
  *pbVar1 = *pbVar1 | 0x10;
  pAVar4 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  value_00._M_str = "416";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(&(message->field_0)._impl_.default_bytes_,value_00,pAVar4)
  ;
  bVar2 = protobuf::internal::ValidateEnum
                    (1,(uint32_t *)proto2_unittest::TestAllTypes_NestedEnum_internal_data_);
  if (!bVar2) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestAllTypes_NestedEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.h"
                  ,0xbddb,
                  "void proto2_unittest::TestAllTypes::_internal_set_default_nested_enum(::proto2_unittest::TestAllTypes_NestedEnum)"
                 );
  }
  (message->field_0)._impl_.default_nested_enum_ = 1;
  pbVar1 = (byte *)((long)&message->field_0 + 5);
  *pbVar1 = *pbVar1 | 0x20;
  bVar2 = protobuf::internal::ValidateEnum
                    (4,(uint32_t *)proto2_unittest::ForeignEnum_internal_data_);
  if (!bVar2) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.h"
                  ,0xbdfa,
                  "void proto2_unittest::TestAllTypes::_internal_set_default_foreign_enum(::proto2_unittest::ForeignEnum)"
                 );
  }
  (message->field_0)._impl_.default_foreign_enum_ = 4;
  pbVar1 = (byte *)((long)&message->field_0 + 5);
  *pbVar1 = *pbVar1 | 0x40;
  bVar2 = protobuf::internal::ValidateEnum
                    (7,(uint32_t *)&proto2_unittest_import::ImportEnum_internal_data_);
  if (bVar2) {
    (message->field_0)._impl_.default_import_enum_ = 7;
    pbVar1 = (byte *)((long)&message->field_0 + 5);
    *pbVar1 = *pbVar1 | 0x80;
    MVar5 = proto2_unittest::TestAllTypes::GetMetadata
                      ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
    MVar6 = proto2_unittest::TestAllTypes::GetMetadata
                      ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
    name._M_str = "default_string_piece";
    name._M_len = 0x14;
    pFVar3 = Descriptor::FindFieldByName(MVar6.descriptor,name);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"424","");
    Reflection::SetString(MVar5.reflection,&message->super_Message,pFVar3,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    MVar5 = proto2_unittest::TestAllTypes::GetMetadata
                      ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
    MVar6 = proto2_unittest::TestAllTypes::GetMetadata
                      ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
    name_00._M_str = "default_cord";
    name_00._M_len = 0xc;
    pFVar3 = Descriptor::FindFieldByName(MVar6.descriptor,name_00);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"425","");
    Reflection::SetString(MVar5.reflection,&message->super_Message,pFVar3,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest_import::ImportEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.h"
                ,0xbe19,
                "void proto2_unittest::TestAllTypes::_internal_set_default_import_enum(::proto2_unittest_import::ImportEnum)"
               );
}

Assistant:

void SetDefaultFields(TestAllTypes* message) {
  message->set_default_int32(401);
  message->set_default_int64(402);
  message->set_default_uint32(403);
  message->set_default_uint64(404);
  message->set_default_sint32(405);
  message->set_default_sint64(406);
  message->set_default_fixed32(407);
  message->set_default_fixed64(408);
  message->set_default_sfixed32(409);
  message->set_default_sfixed64(410);
  message->set_default_float(411);
  message->set_default_double(412);
  message->set_default_bool(false);
  message->set_default_string("415");
  message->set_default_bytes("416");

  message->set_default_nested_enum(TestAllTypes::FOO);
  message->set_default_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_FOO);
  message->set_default_import_enum(ImportEnum<TestAllTypes>::IMPORT_FOO);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->SetString(
      message,
      message->GetDescriptor()->FindFieldByName("default_string_piece"), "424");
  message->GetReflection()->SetString(
      message, message->GetDescriptor()->FindFieldByName("default_cord"),
      "425");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}